

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

string * google::protobuf::compiler::cpp::Formatter::Payload<google::protobuf::OneofDescriptor>
                   (string *__return_storage_ptr__,OneofDescriptor *descriptor)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  vector<int,_std::allocator<int>_> path;
  Annotation annotation;
  vector<int,_std::allocator<int>_> local_88;
  GeneratedCodeInfo_Annotation local_68;
  
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  OneofDescriptor::GetLocationPath(descriptor,&local_88);
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(&local_68);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      iVar1 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar3];
      if (local_68.path_.current_size_ == local_68.path_.total_size_) {
        RepeatedField<int>::Reserve(&local_68.path_,local_68.path_.total_size_ + 1);
      }
      lVar2 = (long)local_68.path_.current_size_;
      local_68.path_.current_size_ = local_68.path_.current_size_ + 1;
      *(int *)((long)local_68.path_.arena_or_elements_ + lVar2 * 4) = iVar1;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  local_68._has_bits_.has_bits_[0] = (uint32  [1])((uint)local_68._has_bits_.has_bits_[0] | 1);
  if (((ulong)local_68._internal_metadata_.
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    local_68._internal_metadata_.
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = *(InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              *)(((ulong)local_68._internal_metadata_.
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_ & 0xfffffffffffffffe) + 0x18);
  }
  if (local_68.source_file_.ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (&local_68.source_file_,
               (Arena *)local_68._internal_metadata_.
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_,(string *)**(undefined8 **)(*(long *)(descriptor + 0x10) + 0x10));
  }
  else {
    std::__cxx11::string::_M_assign((string *)local_68.source_file_.ptr_);
  }
  MessageLite::SerializeAsString_abi_cxx11_(__return_storage_ptr__,(MessageLite *)&local_68);
  GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation(&local_68);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Payload(const Descriptor* descriptor) {
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    GeneratedCodeInfo::Annotation annotation;
    for (int i = 0; i < path.size(); ++i) {
      annotation.add_path(path[i]);
    }
    annotation.set_source_file(descriptor->file()->name());
    return annotation.SerializeAsString();
  }